

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

bool DecodeHexTx(CMutableTransaction *tx,string *hex_tx,bool try_no_witness,bool try_witness)

{
  bool bVar1;
  size_type sVar2;
  bool bVar3;
  size_type sVar4;
  CMutableTransaction *tx_00;
  long in_FS_OFFSET;
  string_view hex_str;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  string_view str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txData;
  DataStream ssData;
  CMutableTransaction tx_legacy;
  CMutableTransaction tx_extended;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_d8;
  DataStream local_c8;
  CMutableTransaction local_a8;
  CMutableTransaction local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_tx->_M_dataplus)._M_p;
  str._M_len = hex_tx->_M_string_length;
  bVar3 = IsHex(str);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_002c6ceb;
  }
  hex_str._M_str = (hex_tx->_M_dataplus)._M_p;
  hex_str._M_len = hex_tx->_M_string_length;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,hex_str);
  CMutableTransaction::CMutableTransaction(&local_70);
  CMutableTransaction::CMutableTransaction(&local_a8);
  if (try_witness) {
    sp.m_size = (long)local_f0._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0._M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_f0._M_impl.super__Vector_impl_data._M_start;
    DataStream::DataStream(&local_c8,sp);
    local_d8.m_params = &TX_WITH_WITNESS;
    local_d8.m_object = &local_70;
    ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<DataStream>
              (&local_d8,&local_c8);
    sVar2 = local_c8.m_read_pos;
    sVar4 = (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
    if (sVar4 != sVar2) goto LAB_002c6bf2;
    tx_00 = &local_70;
    bVar3 = CheckTxScriptsSanity(tx_00);
    bVar1 = true;
    if (!bVar3 && try_no_witness) goto LAB_002c6c04;
LAB_002c6cb7:
    CMutableTransaction::operator=(tx,tx_00);
    bVar3 = true;
  }
  else {
LAB_002c6bf2:
    bVar1 = false;
    bVar3 = false;
    if (try_no_witness) {
LAB_002c6c04:
      sp_00.m_size = (long)local_f0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_f0._M_impl.super__Vector_impl_data._M_start;
      sp_00.m_data = local_f0._M_impl.super__Vector_impl_data._M_start;
      DataStream::DataStream(&local_c8,sp_00);
      local_d8.m_params = &TX_NO_WITNESS;
      local_d8.m_object = &local_a8;
      ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<DataStream>
                (&local_d8,&local_c8);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
      if ((long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos) {
        bVar3 = CheckTxScriptsSanity(&local_a8);
        tx_00 = &local_70;
        if (!bVar1) {
          tx_00 = &local_a8;
        }
        if (bVar3) {
          tx_00 = &local_a8;
        }
      }
      else {
        tx_00 = &local_70;
        if (!bVar1) {
          bVar3 = false;
          goto LAB_002c6cca;
        }
      }
      goto LAB_002c6cb7;
    }
  }
LAB_002c6cca:
  CMutableTransaction::~CMutableTransaction(&local_a8);
  CMutableTransaction::~CMutableTransaction(&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
LAB_002c6ceb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool DecodeHexTx(CMutableTransaction& tx, const std::string& hex_tx, bool try_no_witness, bool try_witness)
{
    if (!IsHex(hex_tx)) {
        return false;
    }

    std::vector<unsigned char> txData(ParseHex(hex_tx));
    return DecodeTx(tx, txData, try_no_witness, try_witness);
}